

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# promise.h
# Opt level: O0

shared_ptr<Promise> __thiscall Promise::Register(Promise *this,shared_ptr<Promise> *p)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<Promise> sVar3;
  shared_ptr<Promise> *p_local;
  
  peVar1 = std::__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)p);
  if ((peVar1->is_registered & 1U) == 0) {
    std::vector<std::shared_ptr<Promise>,_std::allocator<std::shared_ptr<Promise>_>_>::push_back
              (&entries,p);
    peVar1 = std::__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Promise,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)p)
    ;
    peVar1->is_registered = true;
    std::shared_ptr<Promise>::shared_ptr((shared_ptr<Promise> *)this,p);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<Promise>::shared_ptr((shared_ptr<Promise> *)this,p);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Promise>)sVar3.super___shared_ptr<Promise,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static PromisePtr Register(PromisePtr p) {
    if (p->is_registered)
      return p;
    entries.push_back(p);
    p->is_registered = true;
    return p;
  }